

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

flat_example * flatten_example(vw *all,example *ec)

{
  bool bVar1;
  weight *pwVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  flat_example *pfVar5;
  char *__dest;
  long lVar6;
  uint32_t *puVar7;
  full_features_and_source *pfVar8;
  size_t sVar9;
  features *pfVar10;
  byte bVar11;
  full_features_and_source local_98;
  
  bVar11 = 0;
  pfVar5 = calloc_or_throw<flat_example>(1);
  pwVar3 = (ec->l).cs.costs._end;
  pwVar4 = (ec->l).cs.costs.end_array;
  sVar9 = (ec->l).cs.costs.erase_count;
  (pfVar5->l).multi = (ec->l).multi;
  (pfVar5->l).cs.costs._end = pwVar3;
  (pfVar5->l).cs.costs.end_array = pwVar4;
  (pfVar5->l).cs.costs.erase_count = sVar9;
  (pfVar5->l).cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  (pfVar5->l).simple.weight = ec->weight;
  sVar9 = (long)(ec->tag)._end - (long)(ec->tag)._begin;
  pfVar5->tag_len = sVar9;
  if (sVar9 != 0) {
    __dest = calloc_or_throw<char>(sVar9 + 1);
    pfVar5->tag = __dest;
    memcpy(__dest,(ec->tag)._begin,pfVar5->tag_len);
  }
  pfVar5->example_counter = ec->example_counter;
  pfVar5->ft_offset = (ec->super_example_predict).ft_offset;
  pfVar5->num_features = ec->num_features;
  local_98.fs.space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.space_names.erase_count = 0;
  local_98.fs.space_names._begin =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.space_names._end =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.indicies.end_array = (unsigned_long *)0x0;
  local_98.fs.indicies.erase_count = 0;
  local_98.fs.indicies._begin = (unsigned_long *)0x0;
  local_98.fs.indicies._end = (unsigned_long *)0x0;
  local_98.fs.values.end_array = (float *)0x0;
  local_98.fs.values.erase_count = 0;
  local_98.fs.values._begin = (float *)0x0;
  local_98.fs.values._end = (float *)0x0;
  local_98.fs.sum_feat_sq = 0.0;
  bVar1 = (all->weights).sparse;
  puVar7 = &(all->weights).dense_weights._stride_shift;
  if (bVar1 != false) {
    puVar7 = &(all->weights).sparse_weights._stride_shift;
  }
  local_98.stride_shift = *puVar7;
  if (bVar1 == true) {
    local_98.mask = (all->weights).sparse_weights._weight_mask;
    if (local_98.mask != 0) {
      pwVar2 = (weight *)(all->weights).sparse_weights._map._M_h._M_element_count;
joined_r0x001ae290:
      if (pwVar2 != (weight *)0x0) goto LAB_001ae29c;
    }
  }
  else {
    local_98.mask = (all->weights).dense_weights._weight_mask;
    if (local_98.mask != 0) {
      pwVar2 = (all->weights).dense_weights._begin;
      goto joined_r0x001ae290;
    }
  }
  local_98.mask = 0x7fffffffffffffff;
LAB_001ae29c:
  local_98.mask = local_98.mask >> ((byte)local_98.stride_shift & 0x3f);
  GD::foreach_feature<full_features_and_source,_unsigned_long,_&vec_ffs_store>(all,ec,&local_98);
  pfVar8 = &local_98;
  pfVar10 = &pfVar5->fs;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pfVar10->values)._begin = *(float **)pfVar8;
    pfVar8 = (full_features_and_source *)((long)pfVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    pfVar10 = (features *)((long)pfVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  (pfVar5->fs).sum_feat_sq = local_98.fs.sum_feat_sq;
  return pfVar5;
}

Assistant:

flat_example* flatten_example(vw& all, example* ec)
{
  flat_example& fec = calloc_or_throw<flat_example>();
  fec.l = ec->l;
  fec.l.simple.weight = ec->weight;

  fec.tag_len = ec->tag.size();
  if (fec.tag_len > 0)
  {
    fec.tag = calloc_or_throw<char>(fec.tag_len + 1);
    memcpy(fec.tag, ec->tag.begin(), fec.tag_len);
  }

  fec.example_counter = ec->example_counter;
  fec.ft_offset = ec->ft_offset;
  fec.num_features = ec->num_features;

  full_features_and_source ffs;
  ffs.stride_shift = all.weights.stride_shift();
  if (all.weights.not_null())  // TODO:temporary fix. all.weights is not initialized at this point in some cases.
    ffs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  else
    ffs.mask = (uint64_t)LONG_MAX >> all.weights.stride_shift();
  GD::foreach_feature<full_features_and_source, uint64_t, vec_ffs_store>(all, *ec, ffs);

  fec.fs = ffs.fs;

  return &fec;
}